

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

void __thiscall orphanage_tests::same_txid_diff_witness::test_method(same_txid_diff_witness *this)

{
  long lVar1;
  uint256 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  readonly_property<bool> rVar5;
  int iVar6;
  _Rb_tree_color _Var7;
  Wtxid *other;
  iterator in_R8;
  iterator pvVar8;
  iterator pvVar9;
  allocator_type *__a;
  iterator in_R9;
  Wtxid *this_00;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<unsigned_char> __l_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar13;
  _Base_ptr p_Var11;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar12;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_3f0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  CTransactionRef child_mutated;
  CTransactionRef child_normal;
  CTransactionRef parent;
  vector<COutPoint,_std::allocator<COutPoint>_> empty_outpoints;
  undefined1 local_1e8 [24];
  undefined1 local_1d0 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *local_1b8;
  TxOrphanage orphanage;
  FastRandomContext det_rand;
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  expected_children;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&det_rand,true);
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orphanage.m_next_sweep.__d.__r = (duration)0;
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MakeTransactionSpending((orphanage_tests *)&parent,&empty_outpoints,&det_rand);
  puVar2 = &((parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  expected_children._M_t._M_impl._0_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[0];
  expected_children._M_t._M_impl._1_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[1];
  expected_children._M_t._M_impl._2_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[2];
  expected_children._M_t._M_impl._3_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[3];
  expected_children._M_t._M_impl._4_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[4];
  expected_children._M_t._M_impl._5_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[5];
  expected_children._M_t._M_impl._6_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[6];
  expected_children._M_t._M_impl._7_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[7];
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&expected_children;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_1d0,__l,
             (allocator_type *)local_1e8);
  MakeTransactionSpending
            ((orphanage_tests *)&child_normal,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)local_1d0,&det_rand);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)local_1d0);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)&expected_children,
             child_normal.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  uVar3 = expected_children._M_t._M_impl._0_8_;
  local_1e8[0] = (class_property<bool>)true;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0,__l_00,
             (allocator_type *)&local_3f0);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)(uVar3 + 0x50),(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&child_mutated);
  bVar4 = transaction_identifier<false>::operator==
                    (&(child_normal.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash,&(child_mutated.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->hash);
  if (!bVar4) {
    __assert_fail("ptx->GetHash() == mutated_tx->GetHash()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
                  ,0x54,"CTransactionRef orphanage_tests::MakeMutation(const CTransactionRef &)");
  }
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&expected_children);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xf7;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  this_00 = &(child_normal.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_witness_hash;
  other = &(child_mutated.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_witness_hash;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)transaction_identifier<true>::operator!=(this_00,other);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "normal_wtxid != mutated_wtxid";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_260 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  local_1d0[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,_cVar13,
             (size_t)&local_268,0xf7);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xf9;
  file_00.m_begin = (iterator)&local_278;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_288,
             msg_00);
  local_1d0[0] = (class_property<bool>)TxOrphanage::AddTx(&orphanage,&child_normal,0);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "orphanage.AddTx(child_normal, peer)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_290 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,_cVar13,
             (size_t)&local_298,0xf9);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfb;
  file_01.m_begin = (iterator)&local_2a8;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b8,
             msg_01);
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011480b0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc7f1cc;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2c0 = "";
  iVar6 = TxOrphanage::EraseTx(&orphanage,other);
  pvVar8 = local_1d0;
  local_1d0._0_4_ = iVar6;
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  pvVar9 = (iterator)0x2;
  p_Var11 = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&expected_children,&local_2c8,0xfb,1,2,pvVar8,"orphanage.EraseTx(mutated_wtxid)",
             (_Base_ptr)local_1e8,"0");
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xfc;
  file_02.m_begin = (iterator)&local_2d8;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2e8,
             msg_02);
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::HaveTx(&orphanage,this_00);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "orphanage.HaveTx(normal_wtxid)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_2f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  local_1d0[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,
             (check_type)p_Var11,(size_t)&local_2f8,0xfc);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xfd;
  file_03.m_begin = (iterator)&local_308;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_318,
             msg_03);
  bVar4 = TxOrphanage::HaveTx(&orphanage,other);
  local_1d0[0] = (class_property<bool>)!bVar4;
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "!orphanage.HaveTx(mutated_wtxid)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_320 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,
             (check_type)p_Var11,(size_t)&local_328,0xfd);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x100;
  file_04.m_begin = (iterator)&local_338;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_348,
             msg_04);
  local_1d0[0] = (class_property<bool>)TxOrphanage::AddTx(&orphanage,&child_mutated,0);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "orphanage.AddTx(child_mutated, peer)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_350 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,
             (check_type)p_Var11,(size_t)&local_358,0x100);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x101;
  file_05.m_begin = (iterator)&local_368;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_378,
             msg_05);
  local_1d0[0] = (class_property<bool>)TxOrphanage::HaveTx(&orphanage,this_00);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "orphanage.HaveTx(normal_wtxid)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_380 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,
             (check_type)p_Var11,(size_t)&local_388,0x101);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x102;
  file_06.m_begin = (iterator)&local_398;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3a8,
             msg_06);
  local_1d0[0] = (class_property<bool>)TxOrphanage::HaveTx(&orphanage,other);
  local_1d0._8_8_ = (element_type *)0x0;
  local_1d0._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = "orphanage.HaveTx(mutated_wtxid)";
  local_1e8._8_8_ = "";
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       expected_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  expected_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3b0 = "";
  pvVar8 = (iterator)0x0;
  expected_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d0,(lazy_ostream *)&expected_children,1,0,WARN,
             (check_type)p_Var11,(size_t)&local_3b8,0x102);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1d0 + 0x10));
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_1d0,
             &child_normal.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 0x10),
             &child_mutated.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __a = (allocator_type *)&local_3f0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1d0;
  std::
  set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::set(&expected_children,__l_01,(less<std::shared_ptr<const_CTransaction>_> *)local_1e8,__a);
  lVar10 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + lVar10));
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -8);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x106;
  file_07.m_begin = (iterator)&local_3c8;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3d8,
             msg_07);
  TxOrphanage::GetChildrenFromSamePeer(&local_3f0,&orphanage,&parent,0);
  bVar4 = EqualTxns(&expected_children,&local_3f0);
  local_1e8[0] = (class_property<bool>)(class_property<bool>)bVar4;
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (_Base_ptr)0x0;
  local_1b8 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&local_400;
  local_400 = "EqualTxns(expected_children, orphanage.GetChildrenFromSamePeer(parent, peer))";
  local_3f8 = "";
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_408 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1d0,1,0,WARN,(check_type)p_Var11,
             (size_t)&local_410,0x106);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_3f0);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x109;
  file_08.m_begin = (iterator)&local_420;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_430,
             msg_08);
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)0xc7f1cc;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_438 = "";
  _Var7 = TxOrphanage::EraseTx(&orphanage,other);
  pvVar8 = local_1e8;
  local_1e8._0_4_ = _Var7;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3f0.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  pvVar12 = &local_3f0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1d0,&local_440,0x109,1,2,pvVar8,"orphanage.EraseTx(mutated_wtxid)",&local_3f0,"1"
            );
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x10a;
  file_09.m_begin = (iterator)&local_450;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_460,
             msg_09);
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)TxOrphanage::HaveTx(&orphanage,this_00);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (_Base_ptr)0x0;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbcba60;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbcba7e;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_468 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_1b8 = &local_3f0;
  local_1e8[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1d0,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_470,0x10a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x10b;
  file_10.m_begin = (iterator)&local_480;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_490,
             msg_10);
  bVar4 = TxOrphanage::HaveTx(&orphanage,other);
  local_1e8[0] = (class_property<bool>)(class_property<bool>)!bVar4;
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (_Base_ptr)0x0;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbcb9ab;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbcb9cb;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_498 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_1b8 = &local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1d0,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_4a0,0x10b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x10d;
  file_11.m_begin = (iterator)&local_4b0;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4c0,
             msg_11);
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)0xc7f1cc;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4c8 = "";
  _Var7 = TxOrphanage::EraseTx(&orphanage,this_00);
  pvVar8 = local_1e8;
  local_1e8._0_4_ = _Var7;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3f0.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  pvVar12 = &local_3f0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1d0,&local_4d0,0x10d,1,2,pvVar8,"orphanage.EraseTx(normal_wtxid)",&local_3f0,"1")
  ;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x10e;
  file_12.m_begin = (iterator)&local_4e0;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4f0,
             msg_12);
  bVar4 = TxOrphanage::HaveTx(&orphanage,this_00);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (_Base_ptr)0x0;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbcba5f;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbcba7e;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_4f8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_1b8 = &local_3f0;
  local_1e8[0] = (class_property<bool>)(class_property<bool>)!bVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1d0,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_500,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x10f;
  file_13.m_begin = (iterator)&local_510;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_520,
             msg_13);
  bVar4 = TxOrphanage::HaveTx(&orphanage,other);
  local_1e8[0] = (class_property<bool>)(class_property<bool>)!bVar4;
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (_Base_ptr)0x0;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbcb9ab;
  local_3f0.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbcb9cb;
  local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffffffffff00;
  local_1d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_528 = "";
  local_1b8 = &local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1d0,1,0,WARN,(check_type)pvVar12,
             (size_t)&local_530,0x10f);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  std::
  _Rb_tree<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>,_std::_Identity<std::shared_ptr<const_CTransaction>_>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~_Rb_tree(&expected_children._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_mutated.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_normal.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            (&empty_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
  TxOrphanage::~TxOrphanage(&orphanage);
  ChaCha20::~ChaCha20(&det_rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(same_txid_diff_witness)
{
    FastRandomContext det_rand{true};
    TxOrphanage orphanage;
    NodeId peer{0};

    std::vector<COutPoint> empty_outpoints;
    auto parent = MakeTransactionSpending(empty_outpoints, det_rand);

    // Create children to go into orphanage.
    auto child_normal = MakeTransactionSpending({{parent->GetHash(), 0}}, det_rand);
    auto child_mutated = MakeMutation(child_normal);

    const auto& normal_wtxid = child_normal->GetWitnessHash();
    const auto& mutated_wtxid = child_mutated->GetWitnessHash();
    BOOST_CHECK(normal_wtxid != mutated_wtxid);

    BOOST_CHECK(orphanage.AddTx(child_normal, peer));
    // EraseTx fails as transaction by this wtxid doesn't exist.
    BOOST_CHECK_EQUAL(orphanage.EraseTx(mutated_wtxid), 0);
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));

    // Must succeed. Both transactions should be present in orphanage.
    BOOST_CHECK(orphanage.AddTx(child_mutated, peer));
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(orphanage.HaveTx(mutated_wtxid));

    // Outpoints map should track all entries: check that both are returned as children of the parent.
    std::set<CTransactionRef> expected_children{child_normal, child_mutated};
    BOOST_CHECK(EqualTxns(expected_children, orphanage.GetChildrenFromSamePeer(parent, peer)));

    // Erase by wtxid: mutated first
    BOOST_CHECK_EQUAL(orphanage.EraseTx(mutated_wtxid), 1);
    BOOST_CHECK(orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));

    BOOST_CHECK_EQUAL(orphanage.EraseTx(normal_wtxid), 1);
    BOOST_CHECK(!orphanage.HaveTx(normal_wtxid));
    BOOST_CHECK(!orphanage.HaveTx(mutated_wtxid));
}